

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffertest.cc
# Opt level: O1

void TestGrow(void)

{
  _Map_pointer ppCVar1;
  element_type *this;
  ulong uVar2;
  int iVar3;
  size_type size;
  ulong uVar4;
  size_t *local_100;
  size_type local_f8;
  size_t *local_f0;
  size_t reserveSize;
  begin local_e0;
  size_t **local_c8;
  lazy_ostream local_c0;
  undefined8 *local_b0;
  size_t **local_a8;
  _func_int **local_a0;
  assertion_result local_98;
  OutputBuffer ob;
  const_string local_68;
  size_type local_58;
  lazy_ostream local_50;
  undefined8 *local_40;
  char *local_38;
  
  local_e0.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_e0.m_file_name.m_end = "";
  local_e0.m_line_num = 0x72;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0);
  boost::unit_test::anon_unknown_0::s_log_impl();
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_entry_data.m_level = log_messages;
  local_50._vptr_lazy_ostream = (_func_int **)CONCAT71(local_50._vptr_lazy_ostream._1_7_,1);
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd8b8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = (size_t **)0x1b41f0;
  boost::unit_test::unit_test_log_t::operator<<
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_50);
  avro::OutputBuffer::OutputBuffer(&ob,0);
  addDataToBuffer(&ob,0x1000);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x79;
  local_50.m_empty = false;
  local_a0 = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_50._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7b8;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  reserveSize = (ob.pimpl_.px)->size_;
  local_f0 = &reserveSize;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reserveSize == 0x1000);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &avro::detail::kDefaultBlockSize;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x79,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c0,
             "kDefaultBlockSize",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7a;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  reserveSize = (ob.pimpl_.px)->freeSpace_;
  local_100 = &local_f8;
  local_f8._0_4_ = 0;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reserveSize == 0);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &reserveSize;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd838;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x7a,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c0,"0U",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7b;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 0);
  reserveSize = CONCAT44(reserveSize._4_4_,iVar3);
  local_f8._0_4_ = 0;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &reserveSize;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_f8;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x7b,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c0,"0",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x7c;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  reserveSize = CONCAT44(reserveSize._4_4_,iVar3);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  local_f8 = CONCAT44(local_f8._4_4_,1);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.m_empty = false;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &reserveSize;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_f8;
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x7c,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c0,
             "1",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  addDataToBuffer(&ob,0x800);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x81;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  reserveSize = (ob.pimpl_.px)->size_;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reserveSize == 0x1800);
  local_f8 = 0x1800;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &reserveSize;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_f8;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x81,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c0,
             "kDefaultBlockSize + kDefaultBlockSize/2",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x82;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  reserveSize = (ob.pimpl_.px)->freeSpace_;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(reserveSize == 0x800);
  local_f8 = 0x800;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &reserveSize;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_f8;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x82,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c0,
             "kDefaultBlockSize/2",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x83;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  reserveSize = CONCAT44(reserveSize._4_4_,iVar3);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  local_f8._0_4_ = 1;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.m_empty = false;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &reserveSize;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_f8;
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x83,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c0,"1",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x84;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  reserveSize = CONCAT44(reserveSize._4_4_,iVar3);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 2);
  local_f8 = CONCAT44(local_f8._4_4_,2);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.m_empty = false;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &reserveSize;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_100 = &local_f8;
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_a8 = &local_f0;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x84,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c0,
             "2",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  this = ob.pimpl_.px;
  uVar2 = (ob.pimpl_.px)->freeSpace_;
  uVar4 = uVar2 + 0x2000;
  reserveSize = uVar4;
  if (uVar2 < 0xffffffffffffe000) {
    do {
      size = uVar4 - uVar2;
      if (0x3fff < size) {
        size = 0x4000;
      }
      if (size < 0x1001) {
        size = 0x1000;
      }
      avro::detail::BufferImpl::allocChunkChecked(this,size);
      uVar2 = this->freeSpace_;
    } while (uVar2 < uVar4);
  }
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x8a;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_f8 = (ob.pimpl_.px)->size_;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0x1800);
  local_58 = 0x1800;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x8a,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c0,
             "kDefaultBlockSize + kDefaultBlockSize/2",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x8b;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_f8 = (ob.pimpl_.px)->freeSpace_;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == reserveSize);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_100 = &reserveSize;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x8b,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c0,
             "reserveSize",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x8c;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 2);
  local_58._0_4_ = 2;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.m_empty = false;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &local_58;
  local_f8._0_4_ = iVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x8c,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c0,"2",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x8d;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_f8 = CONCAT44(local_f8._4_4_,iVar3);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 2);
  local_58 = CONCAT44(local_58._4_4_,2);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.m_empty = false;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x8d,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c0,
             "2",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  addDataToBuffer(&ob,reserveSize + 1);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x91;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_f8 = (ob.pimpl_.px)->size_;
  local_58 = reserveSize + 0x1801;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == local_58);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x91,CHECK,CHECK_EQUAL,2,"ob.size()",&local_c0,
             "kDefaultBlockSize + kDefaultBlockSize/2 + reserveSize +1",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x92;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  local_f8 = (ob.pimpl_.px)->freeSpace_;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_f8 == 0xfff);
  local_58 = 0xfff;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd7f8;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd7f8;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x92,CHECK,CHECK_EQUAL,2,"ob.freeSpace()",&local_c0,
             "kDefaultBlockSize - 1",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x93;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->writeChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->writeChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->writeChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->writeChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 1);
  local_58._0_4_ = 1;
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_c0.m_empty = false;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &local_58;
  local_f8._0_4_ = iVar3;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x93,CHECK,CHECK_EQUAL,2,"ob.numChunks()",&local_c0,"1",
             &local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1e0890,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x1ba37c);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x94;
  local_50.m_empty = false;
  local_50._vptr_lazy_ostream = local_a0;
  local_40 = &boost::unit_test::lazy_ostream::inst;
  local_38 = "";
  ppCVar1 = ((ob.pimpl_.px)->readChunks_).
            super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>._M_impl.
            super__Deque_impl_data._M_finish._M_node;
  iVar3 = (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_start._M_last -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur) >> 3) * -0x49249249 +
          (int)((ulong)((long)((ob.pimpl_.px)->readChunks_).
                              super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                       (long)((ob.pimpl_.px)->readChunks_).
                             super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_first) >> 3) * -0x49249249
          + ((int)((ulong)((long)ppCVar1 -
                          (long)((ob.pimpl_.px)->readChunks_).
                                super__Deque_base<avro::detail::Chunk,_std::allocator<avro::detail::Chunk>_>
                                ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) + -1 +
            (uint)(ppCVar1 == (_Map_pointer)0x0)) * 9;
  local_f8 = CONCAT44(local_f8._4_4_,iVar3);
  local_98.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(iVar3 == 4);
  local_58 = CONCAT44(local_58._4_4_,4);
  local_98.m_message.px = (element_type *)0x0;
  local_98.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_68.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/buffertest.cc"
  ;
  local_68.m_end = "";
  local_f0 = &local_f8;
  local_c0.m_empty = false;
  local_c0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001dd878;
  local_b0 = &boost::unit_test::lazy_ostream::inst;
  local_a8 = &local_f0;
  local_e0.m_file_name.m_end = (iterator)((ulong)local_e0.m_file_name.m_end & 0xffffffffffffff00);
  local_e0.m_file_name.m_begin = (iterator)&PTR__lazy_ostream_001dd878;
  local_e0.m_line_num = (size_t)&boost::unit_test::lazy_ostream::inst;
  local_c8 = &local_100;
  local_100 = &local_58;
  boost::test_tools::tt_detail::report_assertion
            (&local_98,&local_50,&local_68,0x94,CHECK,CHECK_EQUAL,2,"ob.numDataChunks()",&local_c0,
             "4",&local_e0);
  boost::detail::shared_count::~shared_count(&local_98.m_message.pn);
  boost::detail::shared_count::~shared_count(&ob.pimpl_.pn);
  return;
}

Assistant:

void TestGrow()
{
    BOOST_TEST_MESSAGE( "TestGrow");
    { 
        OutputBuffer ob;

        // add exactly one block
        addDataToBuffer(ob, kDefaultBlockSize);

        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize);
        BOOST_CHECK_EQUAL(ob.freeSpace(), 0U);
        BOOST_CHECK_EQUAL(ob.numChunks(), 0);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 1);

        // add another block, half full
        addDataToBuffer(ob, kDefaultBlockSize/2);

        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize + kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);

        // reserve more capacity
        size_t reserveSize = ob.freeSpace() + 8192;
        ob.reserve(reserveSize);

        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize + kDefaultBlockSize/2);
        BOOST_CHECK_EQUAL(ob.freeSpace(), reserveSize);
        BOOST_CHECK_EQUAL(ob.numChunks(), 2);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 2);

        // fill beyond capacity
        addDataToBuffer(ob, reserveSize + 1);
        BOOST_CHECK_EQUAL(ob.size(), kDefaultBlockSize + kDefaultBlockSize/2 + reserveSize +1);
        BOOST_CHECK_EQUAL(ob.freeSpace(), kDefaultBlockSize - 1);
        BOOST_CHECK_EQUAL(ob.numChunks(), 1);
        BOOST_CHECK_EQUAL(ob.numDataChunks(), 4);
    }
}